

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Crop_x86::forward
          (Crop_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  undefined4 uVar4;
  Mat *pMVar5;
  Mat *this_00;
  pointer pMVar6;
  void *pvVar7;
  long *plVar8;
  Allocator *pAVar9;
  long *plVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined4 uVar22;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined4 uVar30;
  undefined1 uVar31;
  undefined1 uVar33;
  undefined1 uVar35;
  undefined1 uVar37;
  undefined8 uVar38;
  int *piVar45;
  pointer pMVar46;
  int iVar47;
  long lVar48;
  int *piVar49;
  long lVar50;
  int q;
  ulong uVar51;
  long lVar52;
  uint uVar53;
  undefined8 uVar54;
  int iVar55;
  ulong uVar56;
  int z;
  size_t sVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blob_shapes;
  int _outw;
  int _outh;
  int _woffset;
  int local_18c;
  int local_188;
  int local_184;
  int _outc;
  int _hoffset;
  Mat m_1;
  int _outd;
  int _coffset;
  Option *local_128;
  int _doffset;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_118;
  size_t local_110;
  Crop *local_108;
  ulong local_100;
  int local_f4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  int local_88;
  undefined4 local_68;
  undefined4 local_58;
  undefined4 local_48;
  undefined4 uVar16;
  undefined3 uVar18;
  undefined2 uVar20;
  undefined4 uVar24;
  undefined3 uVar26;
  undefined2 uVar28;
  undefined4 uVar32;
  undefined3 uVar34;
  undefined2 uVar36;
  undefined1 uVar39;
  undefined1 uVar40;
  undefined3 uVar41;
  undefined1 uVar42;
  undefined2 uVar43;
  undefined1 uVar44;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_188 = pMVar5->w;
  local_184 = pMVar5->h;
  local_f4 = pMVar5->d;
  local_18c = pMVar5->c;
  uVar53 = pMVar5->dims;
  local_100 = (ulong)uVar53;
  sVar57 = pMVar5->elemsize;
  iVar47 = pMVar5->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_128 = opt;
  local_118 = bottom_blobs;
  local_108 = &this->super_Crop;
  if (((this->super_Crop).starts_expr._M_string_length != 0) &&
     ((this->super_Crop).ends_expr._M_string_length != 0)) {
    local_110 = sVar57;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&bottom_blob_shapes,
               ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5) / 0x48,
               (allocator_type *)&m_1);
    lVar52 = 0;
    uVar56 = 0;
    while( true ) {
      pMVar46 = bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start;
      iVar55 = 1;
      uVar54 = 4;
      pMVar6 = (local_118->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar48 = (long)(local_118->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar6;
      lVar50 = lVar48 % 0x48;
      if ((ulong)(lVar48 / 0x48) <= uVar56) break;
      local_88 = 1;
      switch(*(undefined4 *)((long)&pMVar6->dims + lVar52)) {
      case 1:
        uVar51 = (long)*(int *)((long)&pMVar6->elempack + lVar52) *
                 (long)*(int *)((long)&pMVar6->w + lVar52);
        local_48 = 1;
        iVar59 = 1;
        iVar60 = (int)uVar51;
        break;
      case 2:
        iVar60 = *(int *)((long)&pMVar6->w + lVar52);
        lVar50 = (long)*(int *)((long)&pMVar6->h + lVar52);
        lVar48 = *(int *)((long)&pMVar6->elempack + lVar52) * lVar50;
        iVar59 = (int)lVar48;
        local_48 = 2;
        uVar51 = lVar48 * iVar60;
        break;
      case 3:
        iVar60 = *(int *)((long)&pMVar6->w + lVar52);
        iVar58 = *(int *)((long)&pMVar6->elempack + lVar52) * *(int *)((long)&pMVar6->c + lVar52);
        iVar59 = *(int *)((long)&pMVar6->h + lVar52);
        local_58 = 3;
        lVar48 = (long)iVar59 * (long)iVar60;
        local_48 = local_58;
        goto LAB_0025c4b3;
      case 4:
        iVar60 = *(int *)((long)&pMVar6->w + lVar52);
        iVar59 = *(int *)((long)&pMVar6->h + lVar52);
        local_88 = *(int *)((long)&pMVar6->d + lVar52);
        lVar50 = (long)local_88;
        iVar58 = *(int *)((long)&pMVar6->elempack + lVar52) * *(int *)((long)&pMVar6->c + lVar52);
        local_68 = 4;
        lVar48 = (long)iVar59 * (long)iVar60 * lVar50;
        local_48 = local_68;
LAB_0025c4b3:
        uVar51 = lVar48 + 3U & 0x3ffffffffffffffc;
        goto LAB_0025c50b;
      default:
        local_48 = 0;
        iVar60 = 0;
        iVar59 = 0;
        local_88 = 0;
        uVar54 = 0;
        uVar51 = 0;
        iVar55 = 0;
        iVar58 = 0;
        goto LAB_0025c50b;
      }
      local_88 = 1;
      iVar58 = iVar55;
LAB_0025c50b:
      piVar49 = *(int **)((long)&(bottom_blob_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_start)->refcount + lVar52);
      if (piVar49 != (int *)0x0) {
        LOCK();
        *piVar49 = *piVar49 + -1;
        UNLOCK();
        if (*piVar49 == 0) {
          pvVar7 = *(void **)((long)&(bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->data + lVar52);
          plVar8 = *(long **)((long)&(bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->allocator + lVar52)
          ;
          if (plVar8 == (long *)0x0) {
            free(pvVar7);
          }
          else {
            (**(code **)(*plVar8 + 0x18))(plVar8,pvVar7,lVar50);
          }
        }
      }
      puVar1 = (undefined8 *)((long)&pMVar46->data + lVar52);
      *(undefined8 *)((long)&pMVar46->cstep + lVar52) = 0;
      *(undefined8 *)((long)puVar1 + 0xc) = 0;
      *(undefined8 *)((long)puVar1 + 0x14) = 0;
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&pMVar46->data + lVar52);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pMVar46->elemsize + lVar52) = uVar54;
      *(int *)((long)&pMVar46->elempack + lVar52) = iVar55;
      *(undefined8 *)((long)&pMVar46->allocator + lVar52) = 0;
      puVar2 = (undefined4 *)((long)&pMVar46->dims + lVar52);
      *puVar2 = local_48;
      puVar2[1] = iVar60;
      puVar2[2] = iVar59;
      puVar2[3] = local_88;
      *(int *)((long)&pMVar46->c + lVar52) = iVar58;
      *(ulong *)((long)&pMVar46->cstep + lVar52) = uVar51;
      uVar56 = uVar56 + 1;
      lVar52 = lVar52 + 0x48;
    }
    piVar49 = &_doffset;
    Crop::eval_crop_expr
              (local_108,&bottom_blob_shapes,&_woffset,&_hoffset,piVar49,&_coffset,&_outw,&_outh,
               &_outd,&_outc);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blob_shapes);
    sVar57 = local_110;
    goto LAB_0025c6ec;
  }
  if ((this->super_Crop).woffset != -0xe9) {
    switch(uVar53) {
    case 1:
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
      goto LAB_0025cf79;
    case 2:
      break;
    case 3:
      break;
    case 4:
      break;
    default:
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_0025cf79;
    }
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
LAB_0025cf79:
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    switch(pMVar5[1].dims) {
    case 1:
      m_1.cstep = (long)pMVar5[1].elempack * (long)pMVar5[1].w;
      m_1.dims = 1;
      m_1.w = (int)m_1.cstep;
      m_1.h = 1;
      m_1.d = 1;
      m_1.c = m_1.dims;
      goto LAB_0025d0dd;
    case 2:
      m_1.w = pMVar5[1].w;
      m_1.elemsize = 4;
      m_1.elempack = 1;
      lVar52 = (long)pMVar5[1].elempack * (long)pMVar5[1].h;
      m_1.dims = 2;
      m_1.h = (int)lVar52;
      m_1.d = 1;
      m_1.c = 1;
      m_1.cstep = lVar52 * m_1.w;
      break;
    case 3:
      m_1.w = pMVar5[1].w;
      m_1.h = pMVar5[1].h;
      m_1.c = pMVar5[1].elempack * pMVar5[1].c;
      m_1.dims = 3;
      m_1.d = 1;
      lVar52 = (long)m_1.h * (long)m_1.w;
      goto LAB_0025d0cc;
    case 4:
      m_1.w = pMVar5[1].w;
      m_1.h = pMVar5[1].h;
      m_1.c = pMVar5[1].elempack * pMVar5[1].c;
      m_1.d = pMVar5[1].d;
      m_1.dims = 4;
      lVar52 = (long)m_1.h * (long)m_1.w * (long)m_1.d;
LAB_0025d0cc:
      m_1.cstep = lVar52 + 3U & 0x3ffffffffffffffc;
LAB_0025d0dd:
      m_1.elempack = 1;
      m_1.elemsize = 4;
      break;
    default:
      m_1.cstep = 0;
      m_1.elemsize = 0;
      m_1.elempack = 0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
    }
    m_1.allocator = (Allocator *)0x0;
    m_1.refcount._4_4_ = 0;
    m_1.refcount._0_4_ = 0;
    m_1.data = (void *)0x0;
    piVar49 = &_hoffset;
    Crop::resolve_crop_roi
              (&this->super_Crop,(Mat *)&bottom_blob_shapes,&m_1,&_woffset,piVar49,&_doffset,
               &_coffset,&_outw,&_outh,&_outd,&_outc);
    piVar45 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
    if (piVar45 != (int *)0x0) {
      LOCK();
      *piVar45 = *piVar45 + -1;
      UNLOCK();
      if (*piVar45 == 0) {
        if (m_1.allocator == (Allocator *)0x0) {
          free(m_1.data);
        }
        else {
          (*(m_1.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar45 = (int *)CONCAT44(bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._4_4_,
                              bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._0_4_);
    if (piVar45 != (int *)0x0) {
      LOCK();
      *piVar45 = *piVar45 + -1;
      UNLOCK();
      if (*piVar45 != 0) goto LAB_0025c6ec;
      goto LAB_0025d507;
    }
    goto LAB_0025c6ec;
  }
  switch(uVar53) {
  case 1:
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
    goto LAB_0025cec5;
  case 2:
    break;
  case 3:
    break;
  case 4:
    break;
  default:
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_0025cec5;
  }
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
LAB_0025cec5:
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  piVar49 = &_hoffset;
  Crop::resolve_crop_roi
            (&this->super_Crop,(Mat *)&bottom_blob_shapes,(int *)pMVar5[1].data,&_woffset,piVar49,
             &_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
  piVar45 = (int *)CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_4_);
  if (piVar45 != (int *)0x0) {
    LOCK();
    *piVar45 = *piVar45 + -1;
    UNLOCK();
    if (*piVar45 == 0) {
LAB_0025d507:
      free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start);
    }
  }
LAB_0025c6ec:
  if ((iVar47 != 4) || (3 < (int)local_100 - 1U)) goto LAB_0025d236;
  switch((int)local_100) {
  case 1:
    uVar53 = _outw & 3;
    iVar55 = (uint)(uVar53 == 0) * 3 + 1;
    uVar56 = (long)_outw % (long)iVar55;
    if (local_188 != _outw / iVar55 || uVar53 != 0) {
      if (((_outw | _woffset) & 3U) == 0) {
        Mat::create(this_00,_outw / iVar55,(sVar57 >> 2) << (uVar53 == 0) * '\x02',iVar55,
                    local_128->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        crop_pack4_sse(pMVar5,this_00,0,_woffset / 4);
        return 0;
      }
      goto LAB_0025d236;
    }
    if (this_00 == pMVar5) {
      return 0;
    }
    piVar49 = pMVar5->refcount;
    if (piVar49 != (int *)0x0) {
      LOCK();
      *piVar49 = *piVar49 + 1;
      UNLOCK();
    }
    piVar49 = this_00->refcount;
    if (piVar49 == (int *)0x0) goto LAB_0025d58c;
    LOCK();
    *piVar49 = *piVar49 + -1;
    UNLOCK();
    if (*piVar49 != 0) goto LAB_0025d58c;
    pvVar7 = this_00->data;
    pAVar9 = this_00->allocator;
joined_r0x0025c951:
    if (pAVar9 == (Allocator *)0x0) {
      free(pvVar7);
    }
    else {
      (*pAVar9->_vptr_Allocator[3])(pAVar9,pvVar7,uVar56 & 0xffffffff);
    }
LAB_0025d58c:
    this_00->cstep = 0;
    this_00->data = (void *)0x0;
    this_00->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&this_00->refcount + 4) = (undefined1  [16])0x0;
    this_00->c = 0;
    this_00->dims = 0;
    this_00->w = 0;
    this_00->h = 0;
    this_00->d = 0;
    piVar49 = pMVar5->refcount;
    this_00->data = pMVar5->data;
    this_00->refcount = piVar49;
    this_00->elemsize = pMVar5->elemsize;
    this_00->elempack = pMVar5->elempack;
    this_00->allocator = pMVar5->allocator;
    iVar47 = pMVar5->w;
    iVar55 = pMVar5->h;
    iVar59 = pMVar5->d;
    this_00->dims = pMVar5->dims;
    this_00->w = iVar47;
    this_00->h = iVar55;
    this_00->d = iVar59;
    this_00->c = pMVar5->c;
    this_00->cstep = pMVar5->cstep;
    return 0;
  case 2:
    if (_outw == local_188) {
      iVar55 = (uint)((_outh & 3U) == 0) * 3 + 1;
      uVar56 = (long)_outh % (long)iVar55;
      if (((_outh & 3U) == 0) && (_outh / iVar55 == local_184)) {
        if (this_00 == pMVar5) {
          return 0;
        }
        piVar49 = pMVar5->refcount;
        if (piVar49 != (int *)0x0) {
          LOCK();
          *piVar49 = *piVar49 + 1;
          UNLOCK();
        }
        piVar49 = this_00->refcount;
        if (piVar49 == (int *)0x0) goto LAB_0025d58c;
        LOCK();
        *piVar49 = *piVar49 + -1;
        UNLOCK();
        if (*piVar49 != 0) goto LAB_0025d58c;
        pvVar7 = this_00->data;
        pAVar9 = this_00->allocator;
        goto joined_r0x0025c951;
      }
    }
    if (((_hoffset | _outh) & 3U) == 0) {
      Mat::create(this_00,_outw,_outh >> 2,(sVar57 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                  local_128->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      crop_pack4_sse(pMVar5,this_00,_hoffset / 4,_woffset);
      return 0;
    }
LAB_0025d236:
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&bottom_blobs_unpacked,
               ((long)(local_118->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
               (long)(local_118->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start) / 0x48,(allocator_type *)&bottom_blob_shapes)
    ;
    uVar56 = 0xffffffffffffffff;
    lVar52 = 0;
    do {
      pMVar6 = (local_118->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar56 = uVar56 + 1;
      if ((ulong)(((long)(local_118->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48) <= uVar56
         ) {
        iVar47 = Crop::forward(local_108,&bottom_blobs_unpacked,top_blobs,local_128);
        goto LAB_0025d4aa;
      }
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)((long)&pMVar6->data + lVar52);
      piVar49 = *(int **)((long)&pMVar6->refcount + lVar52);
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = SUB84(piVar49,0);
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)piVar49 >> 0x20);
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)((long)&pMVar6->elemsize + lVar52);
      uVar4 = *(undefined4 *)((long)&pMVar6->elempack + lVar52);
      plVar8 = *(long **)((long)&pMVar6->allocator + lVar52);
      puVar1 = (undefined8 *)((long)&pMVar6->dims + lVar52);
      uVar54 = *puVar1;
      uVar13 = puVar1[1];
      iVar55 = *(int *)((long)&pMVar6->c + lVar52);
      lVar48 = *(long *)((long)&pMVar6->cstep + lVar52);
      if (piVar49 != (int *)0x0) {
        LOCK();
        *piVar49 = *piVar49 + 1;
        UNLOCK();
      }
      if (iVar47 == 1) {
LAB_0025d376:
        pMVar6 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pMVar5 = (Mat *)((long)&(bottom_blobs_unpacked.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_start)->data + lVar52);
        bVar11 = true;
        piVar49 = (int *)CONCAT44(bottom_blob_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_finish._4_4_,
                                  bottom_blob_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_finish._0_4_);
        if (pMVar5 != (Mat *)&bottom_blob_shapes) {
          if (piVar49 != (int *)0x0) {
            LOCK();
            *piVar49 = *piVar49 + 1;
            UNLOCK();
          }
          piVar49 = *(int **)((long)&(bottom_blobs_unpacked.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->refcount + lVar52);
          if (piVar49 != (int *)0x0) {
            LOCK();
            *piVar49 = *piVar49 + -1;
            UNLOCK();
            if (*piVar49 == 0) {
              plVar10 = *(long **)((long)&(bottom_blobs_unpacked.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->allocator +
                                  lVar52);
              if (plVar10 == (long *)0x0) {
                free(*(void **)((long)&(bottom_blobs_unpacked.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->data + lVar52));
              }
              else {
                (**(code **)(*plVar10 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&pMVar6->cstep + lVar52) = 0;
          *(undefined1 (*) [16])((long)&pMVar5->refcount + 4) = (undefined1  [16])0x0;
          pMVar5->data = (void *)0x0;
          pMVar5->refcount = (int *)0x0;
          *(undefined1 (*) [16])((long)&pMVar6->dims + lVar52) = (undefined1  [16])0x0;
          *(undefined4 *)((long)&pMVar6->c + lVar52) = 0;
          *(pointer *)((long)&pMVar6->data + lVar52) =
               bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
          piVar49 = (int *)CONCAT44(bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._0_4_);
          *(int **)((long)&pMVar6->refcount + lVar52) = piVar49;
          *(pointer *)((long)&pMVar6->elemsize + lVar52) =
               bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          *(undefined4 *)((long)&pMVar6->elempack + lVar52) = uVar4;
          *(long **)((long)&pMVar6->allocator + lVar52) = plVar8;
          puVar1 = (undefined8 *)((long)&pMVar6->dims + lVar52);
          *puVar1 = uVar54;
          puVar1[1] = uVar13;
          *(int *)((long)&pMVar6->c + lVar52) = iVar55;
          *(long *)((long)&pMVar6->cstep + lVar52) = lVar48;
        }
      }
      else {
        m_1.data = *(void **)local_128;
        m_1.elemsize = (size_t)local_128->workspace_allocator;
        uVar14 = local_128->openmp_blocktime;
        uVar15 = local_128->use_winograd_convolution;
        uVar17 = local_128->use_sgemm_convolution;
        uVar19 = local_128->use_int8_inference;
        uVar21 = local_128->use_vulkan_compute;
        uVar20 = CONCAT11(uVar21,uVar19);
        uVar18 = CONCAT21(uVar20,uVar17);
        uVar16 = CONCAT31(uVar18,uVar15);
        m_1.allocator = *(Allocator **)&local_128->use_bf16_storage;
        uVar22 = local_128->vulkan_device_index;
        uVar23 = local_128->use_reserved_1;
        uVar25 = local_128->use_image_storage;
        uVar27 = local_128->use_tensor_storage;
        uVar29 = local_128->use_reserved_2;
        uVar28 = CONCAT11(uVar29,uVar27);
        uVar26 = CONCAT21(uVar28,uVar25);
        uVar24 = CONCAT31(uVar26,uVar23);
        uVar30 = local_128->flush_denormals;
        uVar31 = local_128->use_local_pool_allocator;
        uVar33 = local_128->use_shader_local_memory;
        uVar35 = local_128->use_cooperative_matrix;
        uVar37 = local_128->use_winograd23_convolution;
        uVar36 = CONCAT11(uVar37,uVar35);
        uVar34 = CONCAT21(uVar36,uVar33);
        uVar32 = CONCAT31(uVar34,uVar31);
        uVar38._0_1_ = local_128->use_winograd43_convolution;
        uVar38._1_1_ = local_128->use_winograd63_convolution;
        uVar38._2_1_ = local_128->use_a53_a55_optimized_kernel;
        uVar38._3_1_ = local_128->use_fp16_uniform;
        uVar39 = local_128->use_int8_uniform;
        uVar40 = local_128->use_reserved_9;
        uVar42 = local_128->use_reserved_10;
        uVar44 = local_128->use_reserved_11;
        uVar43 = CONCAT11(uVar44,uVar42);
        uVar41 = CONCAT21(uVar43,uVar40);
        uVar38._4_4_ = CONCAT31(uVar41,uVar39);
        m_1.c = (int)uVar38;
        m_1.refcount._0_4_ = SUB84(local_128->workspace_allocator,0);
        m_1.refcount._4_4_ = (undefined4)((ulong)local_128->workspace_allocator >> 0x20);
        m_1.elempack = uVar14;
        m_1._28_4_ = uVar16;
        m_1.dims = uVar22;
        m_1.w = uVar24;
        m_1.h = uVar30;
        m_1.d = uVar32;
        m_1._60_4_ = uVar38._4_4_;
        convert_packing((Mat *)((long)&((local_118->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_start)->data + lVar52),
                        (Mat *)&bottom_blob_shapes,1,(Option *)&m_1);
        if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start != (pointer)0x0) && (iVar55 * lVar48 != 0))
        goto LAB_0025d376;
        piVar49 = (int *)CONCAT44(bottom_blob_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_finish._4_4_,
                                  bottom_blob_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_finish._0_4_);
        bVar11 = false;
      }
      if (piVar49 != (int *)0x0) {
        LOCK();
        *piVar49 = *piVar49 + -1;
        UNLOCK();
        if (*piVar49 == 0) {
          if (plVar8 == (long *)0x0) {
            free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start);
          }
          else {
            (**(code **)(*plVar8 + 0x18))();
          }
        }
      }
      lVar52 = lVar52 + 0x48;
    } while (bVar11);
    iVar47 = -100;
LAB_0025d4aa:
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs_unpacked);
    return iVar47;
  case 4:
    sVar57 = (sVar57 >> 2) << ((_outc & 3U) == 0) * '\x02';
    if (local_f4 == _outd && (local_184 == _outh && local_188 == _outw)) {
      iVar55 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar56 = (long)_outc % (long)iVar55;
      if (((_outc & 3U) == 0) && (_outc / iVar55 == local_18c)) {
        if (this_00 == pMVar5) {
          return 0;
        }
        piVar49 = pMVar5->refcount;
        if (piVar49 != (int *)0x0) {
          LOCK();
          *piVar49 = *piVar49 + 1;
          UNLOCK();
        }
        piVar49 = this_00->refcount;
        if (piVar49 == (int *)0x0) goto LAB_0025d58c;
        LOCK();
        *piVar49 = *piVar49 + -1;
        UNLOCK();
        if (*piVar49 != 0) goto LAB_0025d58c;
        pvVar7 = this_00->data;
        pAVar9 = this_00->allocator;
        goto joined_r0x0025c951;
      }
    }
    if (((_coffset | _outc) & 3U) != 0) goto LAB_0025d236;
    iVar47 = pMVar5->w;
    iVar55 = pMVar5->h;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pMVar5->elemsize;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)(_coffset >> 2) * pMVar5->cstep *
                   (long)bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + (long)pMVar5->data);
    iVar59 = pMVar5->elempack;
    pAVar9 = pMVar5->allocator;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    uVar56 = ((long)pMVar5->d *
              (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage * (long)iVar55 * (long)iVar47
              + 0xfU & 0xfffffffffffffff0) /
             (ulong)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_110 = sVar57;
    if (local_f4 != _outd || (local_184 != _outh || local_188 != _outw)) {
LAB_0025d9b1:
      Mat::create(this_00,_outw,_outh,_outd,_outc / 4,sVar57,4,local_128->blob_allocator);
      iVar60 = -100;
      if ((this_00->data != (void *)0x0) &&
         (uVar51 = (ulong)this_00->c, this_00->cstep * uVar51 != 0)) {
        for (lVar52 = 0; iVar60 = 0, lVar52 < (int)uVar51; lVar52 = lVar52 + 1) {
          for (lVar48 = 0; lVar48 < _outd; lVar48 = lVar48 + 1) {
            m_1.cstep = (long)iVar55 * (long)iVar47;
            m_1.data = (void *)((long)&(bottom_blob_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->data +
                               (long)(_doffset + (int)lVar48) *
                               (long)bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage * m_1.cstep +
                               uVar56 * lVar52 *
                               (long)bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
            m_1.refcount._0_4_ = 0;
            m_1.refcount._4_4_ = 0;
            m_1.elemsize = (size_t)bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage;
            m_1.dims = 2;
            m_1.d = 1;
            m_1.c = 1;
            bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)this_00->elemsize;
            bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((long)this_00->data +
                          lVar48 * (long)bottom_blobs_unpacked.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage *
                          (long)this_00->h * (long)this_00->w +
                          this_00->cstep * lVar52 *
                          (long)bottom_blobs_unpacked.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
            bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            m_1.elempack = iVar59;
            m_1.allocator = pAVar9;
            m_1.w = iVar47;
            m_1.h = iVar55;
            crop_pack4_sse(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
          }
          uVar51 = (ulong)(uint)this_00->c;
        }
      }
    }
    else {
      Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,local_128->blob_allocator,_outd,
                 (void *)(ulong)(uint)_outh);
      sVar57 = local_110;
      piVar49 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (this_00 != &m_1) {
        if (piVar49 != (int *)0x0) {
          LOCK();
          *piVar49 = *piVar49 + 1;
          UNLOCK();
        }
        piVar49 = this_00->refcount;
        if (piVar49 != (int *)0x0) {
          LOCK();
          *piVar49 = *piVar49 + -1;
          UNLOCK();
          if (*piVar49 == 0) {
            if (this_00->allocator == (Allocator *)0x0) {
              free(this_00->data);
            }
            else {
              (*this_00->allocator->_vptr_Allocator[3])();
            }
          }
        }
        this_00->data = m_1.data;
        piVar49 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        this_00->refcount = piVar49;
        this_00->elemsize = m_1.elemsize;
        this_00->elempack = m_1.elempack;
        this_00->allocator = m_1.allocator;
        this_00->dims = m_1.dims;
        this_00->w = m_1.w;
        this_00->h = m_1.h;
        this_00->d = m_1.d;
        this_00->c = m_1.c;
        this_00->cstep = m_1.cstep;
      }
      if (piVar49 != (int *)0x0) {
        LOCK();
        *piVar49 = *piVar49 + -1;
        UNLOCK();
        if (*piVar49 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar60 = -100;
      if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0))
      goto LAB_0025d9b1;
    }
    piVar49 = (int *)CONCAT44(bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._4_4_,
                              bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._0_4_);
    if (piVar49 == (int *)0x0) {
      return iVar60;
    }
    LOCK();
    *piVar49 = *piVar49 + -1;
    UNLOCK();
    if (*piVar49 != 0) {
      return iVar60;
    }
    if (pAVar9 != (Allocator *)0x0) {
      (*pAVar9->_vptr_Allocator[3])();
      return iVar60;
    }
    goto LAB_0025dbb3;
  }
  uVar53 = _outc & 3;
  bVar11 = local_184 == _outh;
  bVar12 = local_188 == _outw;
  if (bVar11 && bVar12) {
    iVar55 = (uint)((_outc & 3U) == 0) * 3 + 1;
    uVar56 = (long)_outc % (long)iVar55;
    if (((_outc & 3U) == 0) && (_outc / iVar55 == local_18c)) {
      if (this_00 == pMVar5) {
        return 0;
      }
      piVar49 = pMVar5->refcount;
      if (piVar49 != (int *)0x0) {
        LOCK();
        *piVar49 = *piVar49 + 1;
        UNLOCK();
      }
      piVar49 = this_00->refcount;
      if (piVar49 == (int *)0x0) goto LAB_0025d58c;
      LOCK();
      *piVar49 = *piVar49 + -1;
      UNLOCK();
      if (*piVar49 != 0) goto LAB_0025d58c;
      pvVar7 = this_00->data;
      pAVar9 = this_00->allocator;
      goto joined_r0x0025c951;
    }
  }
  if (((_coffset | _outc) & 3U) != 0) goto LAB_0025d236;
  iVar47 = pMVar5->w;
  iVar55 = pMVar5->h;
  iVar59 = pMVar5->d;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pMVar5->elemsize;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)(_coffset >> 2) * pMVar5->cstep *
                 (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + (long)pMVar5->data);
  iVar58 = pMVar5->elempack;
  pAVar9 = pMVar5->allocator;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  uVar56 = ((long)iVar59 *
            (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage * (long)iVar55 * (long)iVar47 +
            0xfU & 0xfffffffffffffff0) /
           (ulong)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
  iVar3 = pMVar5->dims;
  if (bVar11 && bVar12) {
    Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,local_128->blob_allocator,_outh,
               (void *)CONCAT71((int7)((ulong)piVar49 >> 8),bVar11 && bVar12));
    piVar49 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
    if (this_00 != &m_1) {
      if (piVar49 != (int *)0x0) {
        LOCK();
        *piVar49 = *piVar49 + 1;
        UNLOCK();
      }
      piVar49 = this_00->refcount;
      if (piVar49 != (int *)0x0) {
        LOCK();
        *piVar49 = *piVar49 + -1;
        UNLOCK();
        if (*piVar49 == 0) {
          if (this_00->allocator == (Allocator *)0x0) {
            free(this_00->data);
          }
          else {
            (*this_00->allocator->_vptr_Allocator[3])();
          }
        }
      }
      this_00->data = m_1.data;
      piVar49 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      this_00->refcount = piVar49;
      this_00->elemsize = m_1.elemsize;
      this_00->elempack = m_1.elempack;
      this_00->allocator = m_1.allocator;
      this_00->dims = m_1.dims;
      this_00->w = m_1.w;
      this_00->h = m_1.h;
      this_00->d = m_1.d;
      this_00->c = m_1.c;
      this_00->cstep = m_1.cstep;
    }
    if (piVar49 != (int *)0x0) {
      LOCK();
      *piVar49 = *piVar49 + -1;
      UNLOCK();
      if (*piVar49 == 0) {
        if (m_1.allocator == (Allocator *)0x0) {
          free(m_1.data);
        }
        else {
          (*(m_1.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar60 = -100;
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0))
    goto LAB_0025d6b6;
  }
  else {
LAB_0025d6b6:
    Mat::create(this_00,_outw,_outh,_outc / 4,(sVar57 >> 2) << (uVar53 == 0) * '\x02',4,
                local_128->blob_allocator);
    iVar60 = -100;
    if ((this_00->data != (void *)0x0) && (uVar51 = (ulong)this_00->c, this_00->cstep * uVar51 != 0)
       ) {
      iVar60 = 0;
      for (lVar52 = 0; lVar52 < (int)uVar51; lVar52 = lVar52 + 1) {
        m_1.data = (void *)((long)&(bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->data +
                           uVar56 * lVar52 *
                           (long)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize = (size_t)bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
        m_1.d = 1;
        m_1.dims = iVar3 + -1;
        m_1.cstep = ((long)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage * (long)iVar55 * (long)iVar47 +
                     0xfU & 0xfffffffffffffff0) /
                    (ulong)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
        if (iVar3 == 4) {
          m_1.cstep = (long)iVar55 * (long)iVar47;
        }
        bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)this_00->elemsize;
        bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(this_00->cstep * lVar52 *
                       (long)bottom_blobs_unpacked.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + (long)this_00->data);
        bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        m_1.elempack = iVar58;
        m_1.allocator = pAVar9;
        m_1.w = iVar47;
        m_1.h = iVar55;
        m_1.c = iVar59;
        crop_pack4_sse(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
        uVar51 = (ulong)(uint)this_00->c;
      }
    }
  }
  piVar49 = (int *)CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_4_);
  if (piVar49 == (int *)0x0) {
    return iVar60;
  }
  LOCK();
  *piVar49 = *piVar49 + -1;
  UNLOCK();
  if (*piVar49 != 0) {
    return iVar60;
  }
  if (pAVar9 != (Allocator *)0x0) {
    (*pAVar9->_vptr_Allocator[3])();
    return iVar60;
  }
LAB_0025dbb3:
  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start);
  return iVar60;
}

Assistant:

int Crop_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
    int _woffset, _hoffset, _doffset, _coffset;
    int _outw, _outh, _outd, _outc;
    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blob_shapes(bottom_blobs.size());
        for (size_t i = 0; i < bottom_blobs.size(); i++)
        {
            bottom_blob_shapes[i] = bottom_blobs[i].shape();
        }
        eval_crop_expr(bottom_blob_shapes, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    std::vector<Mat> bottom_blobs_unpacked(bottom_blobs.size());
    for (size_t i = 0; i < bottom_blobs.size(); i++)
    {
        Mat bottom_blob_unpacked = bottom_blobs[i];
        if (elempack != 1)
        {
            Option opt_pack1 = opt;
            opt_pack1.blob_allocator = opt.workspace_allocator;

            convert_packing(bottom_blobs[i], bottom_blob_unpacked, 1, opt_pack1);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        bottom_blobs_unpacked[i] = bottom_blob_unpacked;
    }

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}